

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O2

void __thiscall
gimage::PNGImageIO::load
          (PNGImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  int *piVar1;
  unsigned_short ***pppuVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  FILE *__stream;
  __jmp_buf_tag *__env;
  ulong uVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  long lVar13;
  long lVar14;
  IOException *pIVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  int j;
  long lVar23;
  int iVar24;
  unsigned_short uVar25;
  int iVar26;
  ulong d;
  png_structp png;
  png_infop info;
  long local_150;
  ulong local_148;
  int local_140;
  allocator local_139;
  ulong local_138;
  valarray<int> vline;
  valarray<int> nline;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  long local_a8;
  long local_a0;
  ulong local_98;
  png_infop end;
  long local_88;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  void *local_40;
  FILE *local_38;
  
  local_140 = ds;
  iVar6 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar6 == '\0') {
    pIVar15 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_c8,name,(allocator *)&png);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,
                   "Can only load PNG image (",&local_c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,")");
    gutil::IOException::IOException(pIVar15,(string *)&vline);
    __cxa_throw(pIVar15,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __stream = fopen(name,"rb");
  if (__stream == (FILE *)0x0) {
    pIVar15 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_c8,name,(allocator *)&png);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,
                   "Cannot open file (",&local_c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,")");
    gutil::IOException::IOException(pIVar15,(string *)&vline);
    __cxa_throw(pIVar15,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png = (png_structp)png_create_read_struct("1.6.37",0,0);
  if (png == (png_structp)0x0) {
    fclose(__stream);
    pIVar15 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&vline,"Cannot allocate handle for reading PNG files",(allocator *)&nline);
    gutil::IOException::IOException(pIVar15,(string *)&vline);
    __cxa_throw(pIVar15,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  info = (png_infop)png_create_info_struct(png);
  if (info == (png_infop)0x0) {
    png_destroy_read_struct(&png,0);
    fclose(__stream);
    pIVar15 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&vline,"Cannot allocate PNG info structure",(allocator *)&nline);
    gutil::IOException::IOException(pIVar15,(string *)&vline);
    __cxa_throw(pIVar15,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  end = (png_infop)png_create_info_struct(png);
  if (end == (png_infop)0x0) {
    png_destroy_read_struct(&png,&info,0);
    fclose(__stream);
    pIVar15 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&vline,"Cannot allocate PNG info structure",(allocator *)&nline);
    gutil::IOException::IOException(pIVar15,(string *)&vline);
    __cxa_throw(pIVar15,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
  iVar6 = _setjmp(__env);
  if (iVar6 != 0) {
    png_destroy_read_struct(&png,&info,&end);
    fclose(__stream);
    pIVar15 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_c8,name,&local_139);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,
                   "Cannot read PNG file (",&local_c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,")");
    gutil::IOException::IOException(pIVar15,(string *)&vline);
    __cxa_throw(pIVar15,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_38 = __stream;
  png_init_io(png,__stream);
  png_read_info(png,info);
  uVar7 = png_get_image_width(png,info);
  uVar8 = png_get_image_height(png,info);
  bVar4 = png_get_color_type(png,info);
  d = 1;
  if ((byte)(bVar4 - 2) < 5) {
    d = (ulong)*(uint *)(&DAT_0014ffb0 + (ulong)(byte)(bVar4 - 2) * 4);
  }
  local_148 = (ulong)uVar8;
  local_150 = (long)local_140;
  if (w < 0) {
    w = (long)((ulong)uVar7 + local_150 + -1) / local_150;
  }
  if (h < 0) {
    h = (long)(local_148 + local_150 + -1) / local_150;
  }
  local_138 = (ulong)uVar7;
  local_98 = h;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize(image,w,h,d);
  lVar17 = image->n;
  lVar18 = -lVar17;
  if (0 < lVar17) {
    lVar18 = lVar17;
  }
  memset(image->pixel,0,lVar18 * 2);
  if (bVar4 == 3) {
    png_set_palette_to_rgb(png);
  }
  bVar5 = png_get_bit_depth(png,info);
  if (bVar5 < 8 && bVar4 == 0) {
    png_set_expand_gray_1_2_4_to_8(png);
  }
  else if ((bVar4 & 4) != 0) {
    png_set_strip_alpha(png);
  }
  iVar6 = png_get_rowbytes(png,info);
  uVar16 = local_148;
  uVar9 = (long)iVar6 * local_148;
  uVar21 = 0xffffffffffffffff;
  if (-1 < (long)uVar9) {
    uVar21 = uVar9;
  }
  pvVar10 = operator_new__(uVar21);
  pvVar11 = operator_new__(uVar16 * 8);
  pvVar12 = pvVar10;
  for (uVar16 = 0; local_148 != uVar16; uVar16 = uVar16 + 1) {
    *(void **)((long)pvVar11 + uVar16 * 8) = pvVar12;
    pvVar12 = (void *)((long)pvVar12 + (long)iVar6);
  }
  local_40 = pvVar10;
  png_read_image(png,pvVar11);
  if ((((local_140 < 2) && (y == 0 && x == 0)) && (w == local_138)) && (local_98 == local_148)) {
    for (uVar16 = 0; uVar16 != local_148; uVar16 = uVar16 + 1) {
      pppuVar2 = image->img;
      uVar9 = 0;
      uVar21 = uVar9;
      for (; uVar9 != local_138; uVar9 = uVar9 + 1) {
        for (uVar22 = 0; d != uVar22; uVar22 = uVar22 + 1) {
          lVar17 = *(long *)((long)pvVar11 + uVar16 * 8);
          iVar6 = (int)uVar21;
          bVar4 = *(byte *)(lVar17 + iVar6);
          uVar25 = (unsigned_short)bVar4;
          if (bVar5 < 0x10) {
            iVar26 = 1;
          }
          else {
            uVar25 = CONCAT11(bVar4,*(undefined1 *)(lVar17 + 1 + (long)iVar6));
            iVar26 = 2;
          }
          uVar21 = (ulong)(uint)(iVar6 + iVar26);
          pppuVar2[uVar22][uVar16][uVar9] = uVar25;
        }
      }
    }
  }
  else {
    nline._M_size._0_4_ = 0;
    std::valarray<int>::valarray(&vline,(int *)&nline,w * d);
    local_c8._M_dataplus._M_p._0_4_ = 0;
    std::valarray<int>::valarray(&nline,(int *)&local_c8,w * d);
    lVar18 = 0;
    iVar6 = 0;
    lVar17 = local_150 * y;
    if (local_150 * y < 1) {
      lVar17 = lVar18;
    }
    lVar14 = -y;
    if (-y == 0 || 0 < y) {
      lVar14 = lVar18;
    }
    iVar26 = (int)d * local_140;
    if (0 < x) {
      iVar6 = (int)x;
    }
    local_a0 = -x;
    if (-x == 0 || 0 < x) {
      local_a0 = lVar18;
    }
    local_48 = local_a0 * d;
    local_50 = local_48 * 4;
    local_58 = d * 4;
    while ((lVar14 < (long)local_98 &&
           (local_60 = (y + lVar14) * local_150, local_60 < (long)local_148))) {
      local_c8._M_dataplus._M_p._0_4_ = 0;
      local_a8 = lVar14;
      local_88 = lVar17;
      std::valarray<int>::operator=(&vline,(int *)&local_c8);
      local_c8._M_dataplus._M_p._0_4_ = 0;
      std::valarray<int>::operator=(&nline,(int *)&local_c8);
      lVar17 = (long)(int)local_88;
      lVar18 = 0;
      while ((lVar13 = lVar18, lVar18 = local_a0, lVar14 = local_48, lVar13 < local_150 &&
             (lVar23 = local_50, iVar24 = iVar6 * iVar26, local_60 + lVar13 < (long)local_148))) {
        while ((lVar20 = lVar18, lVar14 = lVar23, lVar20 < w &&
               (lVar18 = (x + lVar20) * local_150, lVar18 < (long)local_138))) {
          for (lVar23 = 0; (lVar23 < local_150 && (lVar18 + lVar23 < (long)local_138));
              lVar23 = lVar23 + 1) {
            for (uVar16 = 0; d != uVar16; uVar16 = uVar16 + 1) {
              lVar3 = *(long *)((long)pvVar11 + lVar17 * 8);
              bVar4 = *(byte *)(lVar3 + iVar24);
              uVar7 = (uint)bVar4;
              if (bVar5 < 0x10) {
                iVar19 = 1;
              }
              else {
                uVar7 = (uint)CONCAT11(bVar4,*(undefined1 *)(lVar3 + 1 + (long)iVar24));
                iVar19 = 2;
              }
              piVar1 = (int *)((long)vline._M_data + uVar16 * 4 + lVar14);
              *piVar1 = *piVar1 + uVar7;
              iVar24 = iVar24 + iVar19;
              piVar1 = (int *)((long)nline._M_data + uVar16 * 4 + lVar14);
              *piVar1 = *piVar1 + 1;
            }
          }
          lVar23 = lVar14 + local_58;
          local_78 = lVar20;
          local_70 = lVar14;
          lVar18 = lVar20 + 1;
        }
        lVar17 = lVar17 + 1;
        local_68 = lVar13;
        lVar18 = lVar13 + 1;
      }
      for (; (lVar18 < w && ((x + lVar18) * local_150 < (long)local_138)); lVar18 = lVar18 + 1) {
        pppuVar2 = image->img;
        for (uVar16 = 0; d != uVar16; uVar16 = uVar16 + 1) {
          uVar7 = nline._M_data[lVar14 + uVar16];
          if (0 < (int)uVar7) {
            pppuVar2[uVar16][local_a8][lVar18] =
                 (ushort)((int)((uVar7 >> 1) + vline._M_data[lVar14 + uVar16]) / (int)uVar7) & 0xff;
          }
        }
        lVar14 = lVar14 + uVar16;
      }
      lVar14 = local_a8 + 1;
    }
    operator_delete(nline._M_data);
    operator_delete(vline._M_data);
  }
  operator_delete__(pvVar11);
  operator_delete__(local_40);
  png_destroy_read_struct(&png,&info,&end);
  fclose(local_38);
  return;
}

Assistant:

void PNGImageIO::load(ImageU16 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNG image ("+std::string(name)+")");
  }

  // initialize reading a png file

  FILE *in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_read_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(in);
    throw gutil::IOException("Cannot allocate handle for reading PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_read_struct(&png, static_cast<png_infopp>(0), static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  png_infop end=png_create_info_struct(png);

  if (end == 0)
  {
    png_destroy_read_struct(&png, &info, static_cast<png_infopp>(0));
    fclose(in);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *img=0;
  unsigned char **row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] img;
    delete [] row;

    png_destroy_read_struct(&png, &info, &end);
    fclose(in);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // read header data

  png_init_io(png, in);
  png_read_info(png, info);

  long width=static_cast<long>(png_get_image_width(png, info));
  long height=static_cast<long>(png_get_image_height(png, info));

  int depth=1;
  int color=png_get_color_type(png, info);

  if (color == PNG_COLOR_TYPE_PALETTE || color == PNG_COLOR_TYPE_RGB ||
      color == PNG_COLOR_TYPE_RGB_ALPHA)
  {
    depth=3;
  }

  // adapt size of image

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  // transform palette images to RGB

  if (color == PNG_COLOR_TYPE_PALETTE)
  {
    png_set_palette_to_rgb(png);
  }

  int bits=png_get_bit_depth(png, info);

  if (color == PNG_COLOR_TYPE_GRAY && bits < 8)
  {
    png_set_expand_gray_1_2_4_to_8(png);
  }

  // strip alpha channel if available

  if ((color & PNG_COLOR_MASK_ALPHA) != 0)
  {
    png_set_strip_alpha(png);
  }

  // read image completely

  int rn=static_cast<int>(png_get_rowbytes(png, info));
  img=new unsigned char [height*rn];
  row=new unsigned char * [height];

  for (int k=0; k<height; k++)
  {
    row[k]=img+k*rn;
  }

  png_read_image(png, static_cast<png_bytepp>(row));

  // load downscaled part?

  if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
  {
    std::valarray<ImageU16::work_t> vline(0, w*depth);
    std::valarray<int> nline(0, w*depth);

    // skip the first y*ds image rows

    int rk=std::max(0l, y*ds);

    for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
    {
      // load downscaled line

      vline=0;
      nline=0;

      for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
      {
        int  jj=std::max(0l, x)*ds*depth;
        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU16::store_t v;

              if (bits < 16)
              {
                v=static_cast<ImageU16::store_t>(row[rk][jj]);
                jj++;
              }
              else
              {
                v=static_cast<ImageU16::store_t>(row[rk][jj]<<8) | row[rk][jj+1];
                jj+=2;
              }

              if (image.isValidS(v))
              {
                vline[j+d]+=v;
                nline[j+d]++;
              }
            }
          }

          j+=depth;
        }

        rk++;
      }

      // store line into image

      long j=std::max(0l, -x)*depth;

      for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>((vline[j]+nline[j]/2)/nline[j]));
          }

          j++;
        }
      }
    }
  }
  else // load whole image
  {
    for (long k=0; k<height; k++)
    {
      int j=0;

      for (long i=0; i<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          ImageU16::store_t v;

          if (bits < 16)
          {
            v=static_cast<ImageU16::store_t>(row[k][j]);
            j++;
          }
          else
          {
            v=static_cast<ImageU16::store_t>(row[k][j]<<8) | row[k][j+1];
            j+=2;
          }

          image.set(i, k, d, v);
        }
      }
    }
  }

  // close data set

  delete [] row;
  delete [] img;

  png_destroy_read_struct(&png, &info, &end);
  fclose(in);
}